

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qintc.cc
# Opt level: O0

void try_range_check_real<signed_char>(char *description,bool exp_pass,char *a,char *b)

{
  ostream *poVar1;
  char *local_68;
  range_error *e;
  bool passed;
  char *b_local;
  char *a_local;
  bool exp_pass_local;
  char *description_local;
  
  QIntC::range_check<signed_char>(a,b);
  poVar1 = std::operator<<((ostream *)&std::cout,description);
  std::operator<<(poVar1,": okay");
  if (exp_pass) {
    local_68 = " PASSED";
  }
  else {
    local_68 = " FAILED";
  }
  poVar1 = std::operator<<((ostream *)&std::cout,local_68);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

static void
try_range_check_real(char const* description, bool exp_pass, T const& a, T const& b)
{
    bool passed = false;
    try {
        QIntC::range_check(a, b);
        std::cout << description << ": okay";
        passed = true;
    } catch (std::range_error& e) {
        std::cout << description << ": " << e.what();
        passed = false;
    }
    std::cout << ((passed == exp_pass) ? " PASSED" : " FAILED") << std::endl;
}